

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O0

MPP_RET hal_m2vd_vdpu1_start(void *hal,HalTaskInfo *task)

{
  RK_U32 *pRVar1;
  RK_U32 reg_size;
  RK_U32 *regs;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  M2vdHalCtx *ctx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  pRVar1 = *(RK_U32 **)((long)hal + 0x68);
  rd_cfg._8_8_ = pRVar1;
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg.reg._0_4_ = 0x194;
    rd_cfg.reg._4_4_ = 0;
    regs = pRVar1;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),5,&regs);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_m2vd_vdpu1","send cmd failed %d\n","hal_m2vd_vdpu1_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_m2vd_vdpu1","set register read failed %d\n","hal_m2vd_vdpu1_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_m2vd_vdpu1","set register write failed %d\n","hal_m2vd_vdpu1_start",
               (ulong)(uint)ctx._4_4_);
  }
  return ctx._4_4_;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 *regs = (RK_U32 *)ctx->regs;
        RK_U32 reg_size = sizeof(M2vdVdpu1Reg_t);

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}